

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

void __thiscall
AggressiveBotStrategy::AggressiveBotStrategy
          (AggressiveBotStrategy *this,AggressiveBotStrategy *toCopy)

{
  int *piVar1;
  Country *pCVar2;
  string *psVar3;
  
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy,&toCopy->super_PlayerStrategy);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_0013c8c0;
  piVar1 = (toCopy->super_PlayerStrategy).exchangingCardType;
  (this->super_PlayerStrategy).armiesToPlace = (toCopy->super_PlayerStrategy).armiesToPlace;
  (this->super_PlayerStrategy).exchangingCardType = piVar1;
  pCVar2 = (toCopy->super_PlayerStrategy).from;
  (this->super_PlayerStrategy).player = (toCopy->super_PlayerStrategy).player;
  (this->super_PlayerStrategy).from = pCVar2;
  (this->super_PlayerStrategy).to = (toCopy->super_PlayerStrategy).to;
  psVar3 = (string *)operator_new(0x20);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar3,"AGGRESSIVE","");
  (this->super_PlayerStrategy).strategyName = psVar3;
  return;
}

Assistant:

AggressiveBotStrategy::AggressiveBotStrategy(const AggressiveBotStrategy& toCopy) : PlayerStrategy(toCopy) {
    this->exchangingCardType = toCopy.exchangingCardType;
    this->armiesToPlace = toCopy.armiesToPlace;
    this->player = toCopy.player;
    this->from = toCopy.from;
    this->to = toCopy.to;
    this->strategyName = new std::string("AGGRESSIVE");
}